

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool el::Configurations::Parser::parseFromText
               (string *configurationsString,Configurations *sender,Configurations *base)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  istream *piVar4;
  ostream *poVar5;
  string *in_RDI;
  stringstream internalInfoStream;
  string currLevelStr;
  string currConfigStr;
  Level currLevel;
  string line;
  stringstream ss;
  bool parsedSuccessfully;
  Configurations *in_stack_000004e8;
  Level *in_stack_000004f0;
  string *in_stack_000004f8;
  string *in_stack_00000500;
  string *in_stack_00000508;
  Configurations *in_stack_fffffffffffffc18;
  undefined6 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc26;
  undefined1 in_stack_fffffffffffffc27;
  string local_3c8 [32];
  stringstream local_3a8 [16];
  ostream local_398 [392];
  string local_210 [32];
  string local_1f0 [36];
  undefined4 local_1cc;
  string local_1c8 [32];
  stringstream local_1a8 [399];
  byte local_19;
  string *local_8;
  
  local_8 = in_RDI;
  setFromBase((Configurations *)
              CONCAT17(in_stack_fffffffffffffc27,
                       CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)),
              in_stack_fffffffffffffc18);
  local_19 = 0;
  _Var3 = el::base::utils::std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a8,local_8,_Var3);
  std::__cxx11::string::string(local_1c8);
  local_1cc = 0x3f2;
  std::__cxx11::string::string(local_1f0);
  std::__cxx11::string::string(local_210);
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,local_1c8);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    bVar1 = local_19;
    if (!bVar2) break;
    local_19 = parseLine(in_stack_00000508,in_stack_00000500,in_stack_000004f8,in_stack_000004f0,
                         in_stack_000004e8);
    if (!(bool)local_19) {
      std::__cxx11::stringstream::stringstream(local_3a8);
      poVar5 = std::operator<<(local_398,"Unable to parse configuration line: ");
      std::operator<<(poVar5,local_1c8);
      poVar5 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ")
      ;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x168);
      poVar5 = std::operator<<(poVar5,") [parsedSuccessfully");
      poVar5 = std::operator<<(poVar5,"] WITH MESSAGE \"");
      std::__cxx11::stringstream::str();
      poVar5 = std::operator<<(poVar5,local_3c8);
      poVar5 = std::operator<<(poVar5,"\"");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_3c8);
      std::__cxx11::stringstream::~stringstream(local_3a8);
    }
  }
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Configurations::Parser::parseFromText(const std::string& configurationsString, Configurations* sender,
    Configurations* base) {
  sender->setFromBase(base);
  bool parsedSuccessfully = false;
  std::stringstream ss(configurationsString);
  std::string line = std::string();
  Level currLevel = Level::Unknown;
  std::string currConfigStr = std::string();
  std::string currLevelStr = std::string();
  while (std::getline(ss, line)) {
    parsedSuccessfully = parseLine(&line, &currConfigStr, &currLevelStr, &currLevel, sender);
    ELPP_ASSERT(parsedSuccessfully, "Unable to parse configuration line: " << line);
  }
  return parsedSuccessfully;
}